

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

double __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadConstant(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
               *this,char code)

{
  short sVar1;
  int iVar2;
  char in_SIL;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  double value;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  double local_18;
  undefined7 in_stack_fffffffffffffff0;
  
  local_18 = 0.0;
  if (in_SIL == 'l') {
    iVar2 = TextReader<fmt::Locale>::ReadInt<int>
                      ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
    local_18 = (double)iVar2;
  }
  else if (in_SIL == 'n') {
    local_18 = TextReader<fmt::Locale>::ReadDouble
                         ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
  }
  else if (in_SIL == 's') {
    sVar1 = TextReader<fmt::Locale>::ReadInt<short>
                      ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
    local_18 = (double)(int)sVar1;
  }
  else {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected constant");
    TextReader<fmt::Locale>::ReportError<>(in_RDI,unaff_retaddr);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  return local_18;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}